

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Object::readFrom(Object *this,BinaryReader *binary)

{
  int iVar1;
  BinaryReader *this_00;
  BinaryReader *in_RSI;
  long in_RDI;
  int32_t i_2;
  int32_t numInstances;
  int i_1;
  int numLightSources;
  int32_t i;
  int32_t numShapes;
  value_type *in_stack_ffffffffffffff28;
  BinaryReader *__x;
  BinaryReader *in_stack_ffffffffffffff30;
  undefined1 *in_stack_ffffffffffffff50;
  BinaryReader *in_stack_ffffffffffffff58;
  int local_78;
  undefined1 local_70 [20];
  int local_5c;
  int local_58;
  int local_38;
  int local_34;
  string local_30 [32];
  BinaryReader *local_10;
  
  local_10 = in_RSI;
  BinaryReader::read<std::__cxx11::string>(in_stack_ffffffffffffff58);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x60),local_30);
  std::__cxx11::string::~string(local_30);
  local_34 = BinaryReader::read<int>(in_stack_ffffffffffffff30);
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    in_stack_ffffffffffffff58 = local_10;
    BinaryReader::read<int>(in_stack_ffffffffffffff30);
    BinaryReader::getEntity<pbrt::Shape>
              (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
    push_back((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
               *)in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
    std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x111fc6);
  }
  local_58 = BinaryReader::read<int>(in_stack_ffffffffffffff30);
  for (local_5c = 0; local_5c < local_58; local_5c = local_5c + 1) {
    BinaryReader::read<int>(in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff50 = local_70;
    BinaryReader::getEntity<pbrt::LightSource>
              (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    std::
    vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
    ::push_back((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                 *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::shared_ptr<pbrt::LightSource>::~shared_ptr((shared_ptr<pbrt::LightSource> *)0x11207d);
  }
  iVar1 = BinaryReader::read<int>(in_stack_ffffffffffffff30);
  for (local_78 = 0; local_78 < iVar1; local_78 = local_78 + 1) {
    this_00 = (BinaryReader *)(in_RDI + 0x48);
    __x = local_10;
    BinaryReader::read<int>(this_00);
    BinaryReader::getEntity<pbrt::Instance>
              (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
    ::push_back((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                 *)this_00,(value_type *)__x);
    std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x11211f);
  }
  return;
}

Assistant:

void Object::readFrom(BinaryReader &binary) 
  {
    name = binary.read<std::string>();

    // read shapes
    int32_t numShapes = binary.read<int32_t>();
    assert(shapes.empty());
    for (int32_t i=0;i<numShapes;i++)
      shapes.push_back(binary.getEntity<Shape>(binary.read<int32_t>()));

    // read lightSources
    int numLightSources = binary.read<int32_t>();
    assert(lightSources.empty());
    for (int i=0;i<numLightSources;i++)
      lightSources.push_back(binary.getEntity<LightSource>(binary.read<int32_t>()));

    // read instances
    int32_t numInstances = binary.read<int32_t>();
    assert(instances.empty());
    for (int32_t i=0;i<numInstances;i++)
      instances.push_back(binary.getEntity<Instance>(binary.read<int32_t>()));
  }